

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int certificate_type_exists(uint8_t *list,size_t count,uint8_t desired_type)

{
  ulong local_30;
  size_t i;
  uint8_t desired_type_local;
  size_t count_local;
  uint8_t *list_local;
  
  if ((desired_type == '\0') && (count == 0)) {
    list_local._4_4_ = 1;
  }
  else {
    for (local_30 = 0; local_30 < count; local_30 = local_30 + 1) {
      if (list[local_30] == desired_type) {
        return 1;
      }
    }
    list_local._4_4_ = 0;
  }
  return list_local._4_4_;
}

Assistant:

static int certificate_type_exists(uint8_t *list, size_t count, uint8_t desired_type)
{
    /* empty type list means that we default to x509 */
    if (desired_type == PTLS_CERTIFICATE_TYPE_X509 && count == 0)
        return 1;
    for (size_t i = 0; i < count; i++) {
        if (list[i] == desired_type)
            return 1;
    }
    return 0;
}